

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FigureTests-v5.cpp
# Opt level: O0

void __thiscall
v5::FigureTests_v5_cloned_square_via_base_pointer_should_return_same_area_Test::TestBody
          (FigureTests_v5_cloned_square_via_base_pointer_should_return_same_area_Test *this)

{
  bool bVar1;
  char *pcVar2;
  pointer pFVar3;
  double x;
  AssertHelper local_c0;
  Message local_b8 [2];
  EqMatcher<double> local_a8;
  EqMatcher<double> local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_80;
  Message local_78;
  double local_70;
  EqMatcher<double> local_68;
  EqMatcher<double> local_60;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  unique_ptr<v5::Figure,_std::default_delete<v5::Figure>_> local_38;
  unique_ptr<v5::Figure,_std::default_delete<v5::Figure>_> figure;
  Figure *square_figure;
  Square square;
  double a;
  FigureTests_v5_cloned_square_via_base_pointer_should_return_same_area_Test *this_local;
  
  square.a = 4.0;
  v5::Square::Square((Square *)&square_figure,4.0);
  figure._M_t.super___uniq_ptr_impl<v5::Figure,_std::default_delete<v5::Figure>_>._M_t.
  super__Tuple_impl<0UL,_v5::Figure_*,_std::default_delete<v5::Figure>_>.
  super__Head_base<0UL,_v5::Figure_*,_false>._M_head_impl =
       (__uniq_ptr_data<v5::Figure,_std::default_delete<v5::Figure>,_true,_true>)
       (__uniq_ptr_data<v5::Figure,_std::default_delete<v5::Figure>,_true,_true>)&square_figure;
  v5::object::clone<v5::Figure>((object *)&local_38,(Figure *)&square_figure);
  local_68 = testing::Eq<double>(square.a * square.a);
  local_60.rhs_ =
       (double)testing::internal::
               MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<double>>(&local_68);
  local_70 = v5::Square::area((Square *)&square_figure);
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<double>>::operator()
            (local_58,(char *)&local_60,(double *)"square.area()");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/CppCodeReviewers[P]Covariant-Return-Types-and-Smart-Pointers/FigureTests-v5.cpp"
               ,0x59,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::Message::~Message(&local_78);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    x = v5::Square::area((Square *)&square_figure);
    local_a8 = testing::Eq<double>(x);
    local_a0.rhs_ =
         (double)testing::internal::
                 MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<double>>(&local_a8);
    pFVar3 = std::unique_ptr<v5::Figure,_std::default_delete<v5::Figure>_>::operator->(&local_38);
    (*(pFVar3->super_cloneable<v5::Figure>)._vptr_cloneable[3])();
    testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<double>>::
    operator()(local_98,(char *)&local_a0,(double *)"figure->area()");
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
    if (!bVar1) {
      testing::Message::Message(local_b8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/CppCodeReviewers[P]Covariant-Return-Types-and-Smart-Pointers/FigureTests-v5.cpp"
                 ,0x5a,pcVar2);
      testing::internal::AssertHelper::operator=(&local_c0,local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      testing::Message::~Message(local_b8);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      gtest_ar_1.message_.ptr_._4_4_ = 0;
    }
  }
  std::unique_ptr<v5::Figure,_std::default_delete<v5::Figure>_>::~unique_ptr(&local_38);
  v5::Square::~Square((Square *)&square_figure);
  return;
}

Assistant:

TEST(FigureTests_v5, cloned_square_via_base_pointer_should_return_same_area)
{
    auto a = 4.;
    auto square = Square{a};
    auto square_figure = static_cast<Figure*>(&square);
    auto figure = object::clone(square_figure);

    ASSERT_THAT( square.area(), Eq(a*a));
    ASSERT_THAT(figure->area(), Eq(square.area()));
}